

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InductionHelper.cpp
# Opt level: O3

bool Inferences::InductionHelper::isInductionForInfiniteIntervalsOn(void)

{
  bool bVar1;
  
  if (isInductionForInfiniteIntervalsOn()::infinite == '\0') {
    isInductionForInfiniteIntervalsOn();
  }
  bVar1 = isIntInductionOn();
  return (bool)(bVar1 & isInductionForInfiniteIntervalsOn::infinite);
}

Assistant:

bool InductionHelper::isInductionForInfiniteIntervalsOn() {
  static bool infinite = env.options->integerInductionInterval() == Options::IntegerInductionInterval::INFINITE ||
                         env.options->integerInductionInterval() == Options::IntegerInductionInterval::BOTH;
  return isIntInductionOn() && infinite;
}